

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QTzTimeZoneCacheEntry *
QTzTimeZoneCache::findEntry(QTzTimeZoneCacheEntry *__return_storage_ptr__,QByteArray *ianaId)

{
  QList<QByteArray> *this;
  quint8 *pqVar1;
  quint8 qVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  Data *pDVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  anon_struct_2_2_9f07e537 aVar13;
  int iVar14;
  Status SVar15;
  _Rb_tree_node_base *p_Var16;
  pointer pQVar17;
  ulong uVar18;
  QTzTransition *pQVar19;
  int __oflag;
  long lVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  byte *pbVar24;
  uint uVar25;
  ulong uVar26;
  int i;
  _Rb_tree_node_base *p_Var27;
  undefined1 *puVar28;
  ulong uVar29;
  int iVar30;
  qsizetype qVar31;
  long in_FS_OFFSET;
  undefined1 local_158 [24];
  QMap<int,_QByteArray> abbrevMap;
  QArrayDataPointer<QTzType> local_138;
  QArrayDataPointer<QTzTransition> local_118;
  QArrayDataPointer<char> local_f8;
  bool ok;
  QFile local_d8;
  QTzTransitionRule local_c8;
  undefined1 local_b8 [24];
  undefined1 *puStack_a0;
  QTzHeader hdr2;
  QTzHeader hdr;
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&(__return_storage_ptr__->m_preZoneRule).abbreviationIndex = &DAT_aaaaaaaaaaaaaaaa
  ;
  __return_storage_ptr__->m_hasDst = false;
  (__return_storage_ptr__->m_tranTimes).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_tranTimes).d.ptr = (QTzTransitionTime *)0x0;
  (__return_storage_ptr__->m_tranTimes).d.size = 0;
  (__return_storage_ptr__->m_tranRules).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_tranRules).d.ptr = (QTzTransitionRule *)0x0;
  (__return_storage_ptr__->m_tranRules).d.size = 0;
  (__return_storage_ptr__->m_abbreviations).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_abbreviations).d.ptr = (QByteArray *)0x0;
  (__return_storage_ptr__->m_abbreviations).d.size = 0;
  (__return_storage_ptr__->m_posixRule).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_posixRule).d.ptr = (char *)0x0;
  (__return_storage_ptr__->m_posixRule).d.size = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->m_posixRule).d.size + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->m_preZoneRule).stdOffset + 1) = 0;
  local_d8.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile(&local_d8);
  if ((ianaId->d).size == 0) {
    hdr.tzh_magic[0] = '\0';
    hdr.tzh_magic[1] = '\0';
    hdr.tzh_magic[2] = '\0';
    hdr.tzh_magic[3] = '\0';
    hdr.tzh_version = '\0';
    hdr.tzh_reserved[0] = '\0';
    hdr.tzh_reserved[1] = '\0';
    hdr.tzh_reserved[2] = '\0';
    hdr2.tzh_magic[0] = '\0';
    hdr2.tzh_magic[1] = '\0';
    hdr2.tzh_magic[2] = '\0';
    hdr2.tzh_magic[3] = '\0';
    hdr2.tzh_version = '\0';
    hdr2.tzh_reserved[0] = '\0';
    hdr2.tzh_reserved[1] = '\0';
    hdr2.tzh_reserved[2] = '\0';
    hdr2.tzh_reserved[3] = '\0';
    hdr2.tzh_reserved[4] = '\0';
    hdr2.tzh_reserved[5] = '\0';
    hdr2.tzh_reserved[6] = '\0';
    hdr2.tzh_reserved[7] = '\0';
    hdr2.tzh_reserved[8] = '\0';
    hdr2.tzh_reserved[9] = '\0';
    hdr2.tzh_reserved[10] = '\0';
    hdr.tzh_reserved._3_8_ = anon_var_dwarf_121fb0c;
    hdr2.tzh_reserved[0xb] = '\0';
    hdr2.tzh_reserved[0xc] = '\0';
    hdr2.tzh_reserved[0xd] = '\0';
    hdr2.tzh_reserved[0xe] = '\0';
    hdr2.tzh_ttisgmtcnt = 0;
    hdr.tzh_reserved[0xb] = '\x0e';
    hdr.tzh_reserved[0xc] = '\0';
    hdr.tzh_reserved[0xd] = '\0';
    hdr.tzh_reserved[0xe] = '\0';
    hdr.tzh_ttisgmtcnt = 0;
    QFile::setFileName(&local_d8,(QString *)&hdr);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&hdr);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&hdr2);
    iVar14 = QFile::open(&local_d8,(char *)0x1,__oflag);
    if ((char)iVar14 == '\0') goto LAB_003b1326;
  }
  else {
    QString::fromLocal8Bit<void>((QString *)&hdr,ianaId);
    bVar12 = openZoneInfo((QString *)&hdr,&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&hdr);
    if (!bVar12) {
      aVar13 = validatePosixRule(ianaId,false);
      if (((ushort)aVar13 & 1) != 0) {
        __return_storage_ptr__->m_hasDst = 0xff < (ushort)aVar13;
        QByteArray::operator=(&__return_storage_ptr__->m_posixRule,ianaId);
      }
      goto LAB_003b1326;
    }
  }
  local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)local_b8,(QIODevice *)&local_d8);
  ok = false;
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (char *)0x0;
  local_f8.size = 0;
  hdr.tzh_timecnt = 0xaaaaaaaa;
  hdr._36_8_ = &DAT_aaaaaaaaaaaaaaaa;
  hdr._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  hdr.tzh_ttisstdcnt = 0xaaaaaaaa;
  hdr.tzh_leapcnt = 0xaaaaaaaa;
  hdr._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  hdr.tzh_reserved._3_8_ = &DAT_aaaaaaaaaaaaaaaa;
  parseTzHeader(&hdr,(QDataStream *)local_b8,&ok);
  if ((ok == true) && (SVar15 = QDataStream::status((QDataStream *)local_b8), SVar15 == Ok)) {
    local_118.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_118.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_118.ptr = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
    parseTzTransitions((QList<QTzTransition> *)&local_118,(QDataStream *)local_b8,hdr.tzh_timecnt,
                       false);
    SVar15 = QDataStream::status((QDataStream *)local_b8);
    if (SVar15 == Ok) {
      local_138.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_138.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_138.ptr = (QTzType *)&DAT_aaaaaaaaaaaaaaaa;
      parseTzTypes((QList<QTzType> *)&local_138,(QDataStream *)local_b8,hdr.tzh_typecnt);
      SVar15 = QDataStream::status((QDataStream *)local_b8);
      if (SVar15 == Ok) {
        abbrevMap.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
              )&DAT_aaaaaaaaaaaaaaaa;
        parseTzAbbreviations
                  ((QDataStream *)&abbrevMap,(int)local_b8,
                   (QList<QTzType> *)((ulong)hdr._36_8_ >> 0x20));
        SVar15 = QDataStream::status((QDataStream *)local_b8);
        if (SVar15 == Ok) {
          parseTzLeapSeconds((QDataStream *)local_b8,hdr.tzh_leapcnt,false);
          SVar15 = QDataStream::status((QDataStream *)local_b8);
          if (SVar15 == Ok) {
            parseTzIndicators((QList<QTzType> *)&hdr2,(QDataStream *)local_b8,
                              (QList<QTzType> *)&local_138,hdr.tzh_ttisstdcnt,hdr.tzh_ttisgmtcnt);
            QArrayDataPointer<QTzType>::operator=(&local_138,(QArrayDataPointer<QTzType> *)&hdr2);
            QArrayDataPointer<QTzType>::~QArrayDataPointer((QArrayDataPointer<QTzType> *)&hdr2);
            SVar15 = QDataStream::status((QDataStream *)local_b8);
            if (SVar15 == Ok) {
              if ((hdr.tzh_version & 0xfeU) == 0x32) {
                ok = false;
                hdr2.tzh_timecnt = 0xaaaaaaaa;
                hdr2._36_8_ = &DAT_aaaaaaaaaaaaaaaa;
                hdr2._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                hdr2.tzh_ttisstdcnt = 0xaaaaaaaa;
                hdr2.tzh_leapcnt = 0xaaaaaaaa;
                hdr2._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                hdr2.tzh_reserved._3_8_ = &DAT_aaaaaaaaaaaaaaaa;
                parseTzHeader(&hdr2,(QDataStream *)local_b8,&ok);
                if ((ok == true) &&
                   (SVar15 = QDataStream::status((QDataStream *)local_b8), SVar15 == Ok)) {
                  parseTzTransitions((QList<QTzTransition> *)local_158,(QDataStream *)local_b8,
                                     hdr2.tzh_timecnt,true);
                  QArrayDataPointer<QTzTransition>::operator=
                            (&local_118,(QArrayDataPointer<QTzTransition> *)local_158);
                  QArrayDataPointer<QTzTransition>::~QArrayDataPointer
                            ((QArrayDataPointer<QTzTransition> *)local_158);
                  SVar15 = QDataStream::status((QDataStream *)local_b8);
                  if (SVar15 == Ok) {
                    parseTzTypes((QList<QTzType> *)local_158,(QDataStream *)local_b8,
                                 hdr2.tzh_typecnt);
                    QArrayDataPointer<QTzType>::operator=
                              (&local_138,(QArrayDataPointer<QTzType> *)local_158);
                    QArrayDataPointer<QTzType>::~QArrayDataPointer
                              ((QArrayDataPointer<QTzType> *)local_158);
                    SVar15 = QDataStream::status((QDataStream *)local_b8);
                    if (SVar15 == Ok) {
                      parseTzAbbreviations
                                ((QDataStream *)local_158,(int)local_b8,
                                 (QList<QTzType> *)((ulong)hdr2._36_8_ >> 0x20));
                      QtPrivate::
                      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                      ::operator=(&abbrevMap.d,
                                  (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                                   *)local_158);
                      QtPrivate::
                      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                      ::~QExplicitlySharedDataPointerV2
                                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                                  *)local_158);
                      SVar15 = QDataStream::status((QDataStream *)local_b8);
                      if (SVar15 == Ok) {
                        parseTzLeapSeconds((QDataStream *)local_b8,hdr2.tzh_leapcnt,true);
                        SVar15 = QDataStream::status((QDataStream *)local_b8);
                        if (SVar15 == Ok) {
                          parseTzIndicators((QList<QTzType> *)local_158,(QDataStream *)local_b8,
                                            (QList<QTzType> *)&local_138,hdr2.tzh_ttisstdcnt,
                                            hdr2.tzh_ttisgmtcnt);
                          QArrayDataPointer<QTzType>::operator=
                                    (&local_138,(QArrayDataPointer<QTzType> *)local_158);
                          QArrayDataPointer<QTzType>::~QArrayDataPointer
                                    ((QArrayDataPointer<QTzType> *)local_158);
                          SVar15 = QDataStream::status((QDataStream *)local_b8);
                          if (SVar15 == Ok) {
                            local_158._16_8_ = 0;
                            local_158._0_8_ =
                                 (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                                  *)0x0;
                            local_158._8_8_ = (QTzTransition *)0x0;
                            local_c8.stdOffset._0_1_ = 0xaa;
                            QDataStream::operator>>((QDataStream *)local_b8,(qint8 *)&local_c8);
                            if (((char)local_c8.stdOffset == '\n') &&
                               (SVar15 = QDataStream::status((QDataStream *)local_b8), SVar15 == Ok)
                               ) {
                              QDataStream::operator>>((QDataStream *)local_b8,(qint8 *)&local_c8);
                              while (((char)local_c8.stdOffset != '\n' &&
                                     (SVar15 = QDataStream::status((QDataStream *)local_b8),
                                     SVar15 == Ok))) {
                                QByteArray::append((QByteArray *)local_158,(char)local_c8.stdOffset)
                                ;
                                QDataStream::operator>>((QDataStream *)local_b8,(qint8 *)&local_c8);
                              }
                            }
                            qVar31 = local_f8.size;
                            pcVar9 = local_f8.ptr;
                            pDVar8 = local_f8.d;
                            local_f8.d = (Data *)local_158._0_8_;
                            local_f8.ptr = (char *)local_158._8_8_;
                            local_158._0_8_ = pDVar8;
                            local_158._8_8_ = pcVar9;
                            local_f8.size = local_158._16_8_;
                            local_158._16_8_ = qVar31;
                            QArrayDataPointer<char>::~QArrayDataPointer
                                      ((QArrayDataPointer<char> *)local_158);
                            SVar15 = QDataStream::status((QDataStream *)local_b8);
                            if (SVar15 == Ok) goto LAB_003b15b8;
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
LAB_003b15b8:
                if (local_f8.size != 0) {
                  aVar13 = validatePosixRule((QByteArray *)&local_f8,false);
                  if (((ushort)aVar13 & 1) == 0) goto LAB_003b12ee;
                  QByteArray::operator=
                            (&__return_storage_ptr__->m_posixRule,(QByteArray *)&local_f8);
                  __return_storage_ptr__->m_hasDst = 0xff < (ushort)aVar13;
                }
                if (abbrevMap.d.d.ptr ==
                    (totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
                     )0x0) {
                  qVar31 = 0;
                }
                else {
                  qVar31 = (qsizetype)*(int *)((long)abbrevMap.d.d.ptr + 0x30);
                }
                this = &__return_storage_ptr__->m_abbreviations;
                QList<QByteArray>::clear(this);
                QList<QByteArray>::reserve(this,qVar31);
                hdr2.tzh_magic[0] = '\0';
                hdr2.tzh_magic[1] = '\0';
                hdr2.tzh_magic[2] = '\0';
                hdr2.tzh_magic[3] = '\0';
                hdr2.tzh_version = '\0';
                hdr2.tzh_reserved[0] = '\0';
                hdr2.tzh_reserved[1] = '\0';
                hdr2.tzh_reserved[2] = '\0';
                hdr2.tzh_reserved[3] = '\0';
                hdr2.tzh_reserved[4] = '\0';
                hdr2.tzh_reserved[5] = '\0';
                hdr2.tzh_reserved[6] = '\0';
                hdr2.tzh_reserved[7] = '\0';
                hdr2.tzh_reserved[8] = '\0';
                hdr2.tzh_reserved[9] = '\0';
                hdr2.tzh_reserved[10] = '\0';
                hdr2.tzh_reserved[0xb] = '\0';
                hdr2.tzh_reserved[0xc] = '\0';
                hdr2.tzh_reserved[0xd] = '\0';
                hdr2.tzh_reserved[0xe] = '\0';
                hdr2.tzh_ttisgmtcnt = 0;
                QList<int>::reserve((QList<int> *)&hdr2,qVar31);
                if (abbrevMap.d.d.ptr ==
                    (totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
                     )0x0) {
                  p_Var16 = (_Rb_tree_node_base *)0x0;
                }
                else {
                  p_Var16 = *(_Rb_tree_node_base **)((long)abbrevMap.d.d.ptr + 0x20);
                }
                p_Var27 = (_Rb_tree_node_base *)((long)abbrevMap.d.d.ptr + 0x10);
                if (abbrevMap.d.d.ptr ==
                    (totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
                     )0x0) {
                  p_Var27 = (_Rb_tree_node_base *)0x0;
                }
                for (; p_Var16 != p_Var27;
                    p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
                  QList<QByteArray>::emplaceBack<QByteArray_const&>
                            (this,(QByteArray *)&p_Var16[1]._M_parent);
                  QList<int>::append((QList<int> *)&hdr2,p_Var16[1]._M_color);
                }
                for (puVar28 = (undefined1 *)0x0; qVar31 = local_118.size,
                    puVar28 < (ulong)local_138.size; puVar28 = puVar28 + 1) {
                  qVar31 = QtPrivate::indexOf<int,unsigned_char>
                                     ((QList<int> *)&hdr2,&local_138.ptr[(long)puVar28].tz_abbrind,0
                                     );
                  pQVar17 = QList<QTzType>::data((QList<QTzType> *)&local_138);
                  pQVar17[(long)puVar28].tz_abbrind = (quint8)qVar31;
                }
                if ((undefined1 *)local_138.size == (undefined1 *)0x0) {
                  iVar14 = (__return_storage_ptr__->m_preZoneRule).stdOffset;
                }
                else {
                  iVar14 = (local_138.ptr)->tz_gmtoff;
                  qVar2 = (local_138.ptr)->tz_abbrind;
                  (__return_storage_ptr__->m_preZoneRule).stdOffset = iVar14;
                  (__return_storage_ptr__->m_preZoneRule).dstOffset = 0;
                  (__return_storage_ptr__->m_preZoneRule).abbreviationIndex = qVar2;
                }
                lVar20 = local_118.size << 4;
                pQVar19 = local_118.ptr;
                do {
                  if (lVar20 == 0) goto LAB_003b1725;
                  pqVar1 = &pQVar19->tz_typeind;
                  pQVar19 = pQVar19 + 1;
                  lVar20 = lVar20 + -0x10;
                } while (local_138.ptr[*pqVar1].tz_isdst != false);
                iVar14 = local_138.ptr[*pqVar1].tz_gmtoff;
LAB_003b1725:
                iVar30 = (int)local_118.size;
                QList<QTzTransitionTime>::reserve(&__return_storage_ptr__->m_tranTimes,(long)iVar30)
                ;
                uVar29 = 0;
                uVar18 = 0;
                if (0 < iVar30) {
                  uVar18 = qVar31 & 0xffffffff;
                }
                iVar21 = 0xe10;
                lVar20 = 0x18;
                for (; pQVar19 = local_118.ptr, uVar29 != uVar18; uVar29 = uVar29 + 1) {
                  local_158._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_158._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  bVar3 = local_118.ptr[uVar29].tz_typeind;
                  iVar5 = local_138.ptr[bVar3].tz_gmtoff;
                  iVar10 = iVar5;
                  if (((local_138.ptr[bVar3].tz_isdst & 1U) != 0) &&
                     (iVar10 = iVar14, iVar5 != iVar21 + iVar14)) {
                    iVar21 = iVar5 - iVar21;
                    iVar10 = iVar5 + -0xe10;
                    pbVar24 = (byte *)((long)&(local_118.ptr)->tz_time + lVar20);
                    uVar26 = uVar29 & 0xffffffff;
                    do {
                      uVar25 = (int)uVar26 + 1;
                      uVar26 = (ulong)uVar25;
                      if (iVar30 <= (int)uVar25) break;
                      bVar4 = *pbVar24;
                      iVar11 = iVar14;
                      if (((((local_138.ptr[bVar4].tz_isdst & 1U) == 0) &&
                           (iVar6 = local_138.ptr[bVar4].tz_gmtoff, iVar6 != iVar14)) &&
                          (uVar25 = iVar6 - iVar21, iVar11 = iVar21, uVar25 != 0)) &&
                         ((iVar11 = iVar10, iVar10 != iVar14 && (iVar10 != iVar6)))) {
                        if (iVar6 < iVar5) {
                          if (iVar14 < iVar5) {
LAB_003b184f:
                            uVar22 = -uVar25;
                            if (0 < (int)uVar25) {
                              uVar22 = uVar25;
                            }
                            uVar23 = iVar14 - iVar21;
                            uVar25 = -uVar23;
                            if (0 < (int)uVar23) {
                              uVar25 = uVar23;
                            }
                            iVar11 = iVar14;
                            if (uVar25 <= uVar22) goto LAB_003b183d;
                          }
                          iVar11 = iVar6;
                        }
                        else {
                          iVar11 = iVar14;
                          if (iVar5 <= iVar14) goto LAB_003b184f;
                        }
                      }
LAB_003b183d:
                      iVar14 = iVar11;
                      pbVar24 = pbVar24 + 0x10;
                    } while ((local_138.ptr[bVar4].tz_isdst & 1U) != 0);
                    iVar21 = iVar5 - iVar14;
                    iVar10 = iVar14;
                  }
                  iVar14 = iVar10;
                  local_c8.dstOffset = iVar5 - iVar14;
                  local_c8.stdOffset = iVar14;
                  local_c8._9_3_ = 0xaaaaaa;
                  local_c8.abbreviationIndex = local_138.ptr[bVar3].tz_abbrind;
                  qVar31 = QtPrivate::indexOf<QTzTransitionRule,QTzTransitionRule>
                                     (&__return_storage_ptr__->m_tranRules,&local_c8,0);
                  if ((int)qVar31 == -1) {
                    if (local_c8.dstOffset != 0) {
                      __return_storage_ptr__->m_hasDst = true;
                    }
                    local_158[8] = (char)(__return_storage_ptr__->m_tranRules).d.size;
                    QList<QTzTransitionRule>::emplaceBack<QTzTransitionRule_const&>
                              (&__return_storage_ptr__->m_tranRules,&local_c8);
                  }
                  else {
                    local_158[8] = (char)qVar31;
                  }
                  local_158._0_8_ = pQVar19[uVar29].tz_time * 1000;
                  QList<QTzTransitionTime>::emplaceBack<QTzTransitionTime_const&>
                            (&__return_storage_ptr__->m_tranTimes,(QTzTransitionTime *)local_158);
                  lVar20 = lVar20 + 0x10;
                }
                QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&hdr2);
              }
            }
          }
        }
LAB_003b12ee:
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&abbrevMap.d);
      }
      QArrayDataPointer<QTzType>::~QArrayDataPointer(&local_138);
    }
    QArrayDataPointer<QTzTransition>::~QArrayDataPointer(&local_118);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_f8);
  QDataStream::~QDataStream((QDataStream *)local_b8);
LAB_003b1326:
  QFile::~QFile(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar7) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTzTimeZoneCacheEntry QTzTimeZoneCache::findEntry(const QByteArray &ianaId)
{
    QTzTimeZoneCacheEntry ret;
    QFile tzif;
    if (ianaId.isEmpty()) {
        // Open system tz
        tzif.setFileName(QStringLiteral("/etc/localtime"));
        if (!tzif.open(QIODevice::ReadOnly))
            return ret;
    } else if (!openZoneInfo(QString::fromLocal8Bit(ianaId), &tzif)) {
        // ianaId may be a POSIX rule, taken from $TZ or /etc/TZ
        auto check = validatePosixRule(ianaId);
        if (check.isValid) {
            ret.m_hasDst = check.hasDst;
            ret.m_posixRule = ianaId;
        }
        return ret;
    }

    QDataStream ds(&tzif);

    // Parse the old version block of data
    bool ok = false;
    QByteArray posixRule;
    QTzHeader hdr = parseTzHeader(ds, &ok);
    if (!ok || ds.status() != QDataStream::Ok)
        return ret;
    QList<QTzTransition> tranList = parseTzTransitions(ds, hdr.tzh_timecnt, false);
    if (ds.status() != QDataStream::Ok)
        return ret;
    QList<QTzType> typeList = parseTzTypes(ds, hdr.tzh_typecnt);
    if (ds.status() != QDataStream::Ok)
        return ret;
    QMap<int, QByteArray> abbrevMap = parseTzAbbreviations(ds, hdr.tzh_charcnt, typeList);
    if (ds.status() != QDataStream::Ok)
        return ret;
    parseTzLeapSeconds(ds, hdr.tzh_leapcnt, false);
    if (ds.status() != QDataStream::Ok)
        return ret;
    typeList = parseTzIndicators(ds, typeList, hdr.tzh_ttisstdcnt, hdr.tzh_ttisgmtcnt);
    if (ds.status() != QDataStream::Ok)
        return ret;

    // If version 2 then parse the second block of data
    if (hdr.tzh_version == '2' || hdr.tzh_version == '3') {
        ok = false;
        QTzHeader hdr2 = parseTzHeader(ds, &ok);
        if (!ok || ds.status() != QDataStream::Ok)
            return ret;
        tranList = parseTzTransitions(ds, hdr2.tzh_timecnt, true);
        if (ds.status() != QDataStream::Ok)
            return ret;
        typeList = parseTzTypes(ds, hdr2.tzh_typecnt);
        if (ds.status() != QDataStream::Ok)
            return ret;
        abbrevMap = parseTzAbbreviations(ds, hdr2.tzh_charcnt, typeList);
        if (ds.status() != QDataStream::Ok)
            return ret;
        parseTzLeapSeconds(ds, hdr2.tzh_leapcnt, true);
        if (ds.status() != QDataStream::Ok)
            return ret;
        typeList = parseTzIndicators(ds, typeList, hdr2.tzh_ttisstdcnt, hdr2.tzh_ttisgmtcnt);
        if (ds.status() != QDataStream::Ok)
            return ret;
        posixRule = parseTzPosixRule(ds);
        if (ds.status() != QDataStream::Ok)
            return ret;
    }
    // Translate the TZ file's raw data into our internal form:

    if (!posixRule.isEmpty()) {
        auto check = validatePosixRule(posixRule);
        if (!check.isValid) // We got a POSIX rule, but it was malformed:
            return ret;
        ret.m_posixRule = posixRule;
        ret.m_hasDst = check.hasDst;
    }

    // Translate the array-index-based tz_abbrind into list index
    const int size = abbrevMap.size();
    ret.m_abbreviations.clear();
    ret.m_abbreviations.reserve(size);
    QList<int> abbrindList;
    abbrindList.reserve(size);
    for (auto it = abbrevMap.cbegin(), end = abbrevMap.cend(); it != end; ++it) {
        ret.m_abbreviations.append(it.value());
        abbrindList.append(it.key());
    }
    // Map tz_abbrind from map's keys (as initially read) to abbrindList's
    // indices (used hereafter):
    for (int i = 0; i < typeList.size(); ++i)
        typeList[i].tz_abbrind = abbrindList.indexOf(typeList.at(i).tz_abbrind);

    // TODO: is typeList[0] always the "before zones" data ? It seems to be ...
    if (typeList.size())
        ret.m_preZoneRule = { typeList.at(0).tz_gmtoff, 0, typeList.at(0).tz_abbrind };

    // Offsets are stored as total offset, want to know separate UTC and DST offsets
    // so find the first non-dst transition to use as base UTC Offset
    int utcOffset = ret.m_preZoneRule.stdOffset;
    for (const QTzTransition &tran : std::as_const(tranList)) {
        if (!typeList.at(tran.tz_typeind).tz_isdst) {
            utcOffset = typeList.at(tran.tz_typeind).tz_gmtoff;
            break;
        }
    }

    // Now for each transition time calculate and store our rule:
    const int tranCount = tranList.size();
    ret.m_tranTimes.reserve(tranCount);
    // The DST offset when in effect: usually stable, usually an hour:
    int lastDstOff = 3600;
    for (int i = 0; i < tranCount; i++) {
        const QTzTransition &tz_tran = tranList.at(i);
        QTzTransitionTime tran;
        QTzTransitionRule rule;
        const QTzType tz_type = typeList.at(tz_tran.tz_typeind);

        // Calculate the associated Rule
        if (!tz_type.tz_isdst) {
            utcOffset = tz_type.tz_gmtoff;
        } else if (Q_UNLIKELY(tz_type.tz_gmtoff != utcOffset + lastDstOff)) {
            /*
              This might be a genuine change in DST offset, but could also be
              DST starting at the same time as the standard offset changed.  See
              if DST's end gives a more plausible utcOffset (i.e. one closer to
              the last we saw, or a simple whole hour):
            */
            // Standard offset inferred from net offset and expected DST offset:
            const int inferStd = tz_type.tz_gmtoff - lastDstOff; // != utcOffset
            for (int j = i + 1; j < tranCount; j++) {
                const QTzType new_type = typeList.at(tranList.at(j).tz_typeind);
                if (!new_type.tz_isdst) {
                    const int newUtc = new_type.tz_gmtoff;
                    if (newUtc == utcOffset) {
                        // DST-end can't help us, avoid lots of messy checks.
                    // else: See if the end matches the familiar DST offset:
                    } else if (newUtc == inferStd) {
                        utcOffset = newUtc;
                    // else: let either end shift us to one hour as DST offset:
                    } else if (tz_type.tz_gmtoff - 3600 == utcOffset) {
                        // Start does it
                    } else if (tz_type.tz_gmtoff - 3600 == newUtc) {
                        utcOffset = newUtc; // End does it
                    // else: prefer whichever end gives DST offset closer to
                    // last, but consider any offset > 0 "closer" than any <= 0:
                    } else if (newUtc < tz_type.tz_gmtoff
                               ? (utcOffset >= tz_type.tz_gmtoff
                                  || qAbs(newUtc - inferStd) < qAbs(utcOffset - inferStd))
                               : (utcOffset >= tz_type.tz_gmtoff
                                  && qAbs(newUtc - inferStd) < qAbs(utcOffset - inferStd))) {
                        utcOffset = newUtc;
                    }
                    break;
                }
            }
            lastDstOff = tz_type.tz_gmtoff - utcOffset;
        }
        rule.stdOffset = utcOffset;
        rule.dstOffset = tz_type.tz_gmtoff - utcOffset;
        rule.abbreviationIndex = tz_type.tz_abbrind;

        // If the rule already exist then use that, otherwise add it
        int ruleIndex = ret.m_tranRules.indexOf(rule);
        if (ruleIndex == -1) {
            if (rule.dstOffset != 0)
                ret.m_hasDst = true;
            tran.ruleIndex = ret.m_tranRules.size();
            ret.m_tranRules.append(rule);
        } else {
            tran.ruleIndex = ruleIndex;
        }

        tran.atMSecsSinceEpoch = tz_tran.tz_time * 1000;
        ret.m_tranTimes.append(tran);
    }

    return ret;
}